

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

ReadFileResult cmCMakePresetsGraphInternal::PresetIntHelper(int *out,Value *value)

{
  ReadFileResult RVar1;
  Value *local_18;
  
  if (PresetIntHelper(int&,Json::Value_const*)::helper == '\0') {
    PresetIntHelper();
  }
  local_18 = value;
  if (PresetIntHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*PresetIntHelper::helper._M_invoker)
                      ((_Any_data *)&PresetIntHelper::helper,out,&local_18);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

cmCMakePresetsGraph::ReadFileResult PresetIntHelper(int& out,
                                                    const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Int(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET);

  return helper(out, value);
}